

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O2

double CoordDistance(double lat1,double lon1,double lat2,double lon2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  
  auVar5._0_8_ = lat2 * 3.141592653589793;
  auVar5._8_8_ = lat1 * 3.141592653589793;
  auVar6._0_8_ = lon2 * 3.141592653589793;
  auVar6._8_8_ = lon1 * 3.141592653589793;
  auVar5 = divpd(auVar5,_DAT_002107b0);
  auVar6 = divpd(auVar6,_DAT_002107b0);
  dVar4 = sin((auVar5._0_8_ - auVar5._8_8_) * 0.5);
  local_48 = auVar6._0_8_;
  uStack_40 = auVar6._8_8_;
  dVar1 = sin((local_48 - uStack_40) * 0.5);
  dVar2 = cos(auVar5._8_8_);
  dVar3 = cos(auVar5._0_8_);
  dVar4 = dVar4 * dVar4 + dVar3 * dVar2 * dVar1 * dVar1;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  dVar4 = asin(dVar4);
  return dVar4 * 12742000.0;
}

Assistant:

double CoordDistance (double lat1, double lon1, double lat2, double lon2)
{
    lat1 *= PI; lat1 /= 180.0;              // in-place degree-to-rad conversion
    lon1 *= PI; lon1 /= 180.0;
    lat2 *= PI; lat2 /= 180.0;
    lon2 *= PI; lon2 /= 180.0;

    using namespace std;
    const double x = sin((lat2 - lat1) / 2);
    const double y = sin((lon2 - lon1) / 2);
    return EARTH_D_M * asin(sqrt((x * x) + (cos(lat1) * cos(lat2) * y * y)));
}